

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseStringLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   *this,UnicodeChar quoteChar)

{
  UnicodeChar c_00;
  CompileMessage local_c0;
  CompileMessage local_78;
  int local_3c;
  int local_38;
  int digitValue;
  int i;
  UnicodeChar c;
  size_type local_28;
  UnicodeChar local_1c;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *pTStack_18;
  UnicodeChar quoteChar_local;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  
  if ((quoteChar == 0x22) || (quoteChar == 0x27)) {
    local_1c = quoteChar;
    pTStack_18 = this;
    UTF8Reader::operator++(&this->input);
    std::initializer_list<char>::initializer_list((initializer_list<char> *)&i);
    std::__cxx11::string::operator=((string *)&this->currentStringValue,_i,local_28);
    while (digitValue = UTF8Reader::getAndAdvance(&this->input), digitValue != local_1c) {
      if (digitValue == 0x5c) {
        digitValue = UTF8Reader::getAndAdvance(&this->input);
        switch(digitValue) {
        case 0x22:
        case 0x27:
        case 0x2f:
        case 0x5c:
          break;
        case 0x61:
          digitValue = 7;
          break;
        case 0x62:
          digitValue = 8;
          break;
        case 0x66:
          digitValue = 0xc;
          break;
        case 0x6e:
          digitValue = 10;
          break;
        case 0x72:
          digitValue = 0xd;
          break;
        case 0x74:
          digitValue = 9;
          break;
        case 0x75:
          digitValue = 0;
          local_38 = 4;
          while (local_38 = local_38 + -1, -1 < local_38) {
            c_00 = UTF8Reader::getAndAdvance(&this->input);
            local_3c = choc::text::hexDigitToInt(c_00);
            if (local_3c < 0) {
              UTF8Reader::operator=(&(this->location).location,&this->input);
              Errors::errorInEscapeCode<>();
              (*this->_vptr_Tokeniser[2])(this,&local_78);
              CompileMessage::~CompileMessage(&local_78);
            }
            digitValue = digitValue * 0x10 + local_3c;
          }
        }
      }
      if (digitValue == 0) {
        Errors::endOfInputInStringConstant<>();
        (*this->_vptr_Tokeniser[2])(this,&local_c0);
        CompileMessage::~CompileMessage(&local_c0);
      }
      appendUTF8(&this->currentStringValue,digitValue);
    }
    checkCharacterImmediatelyAfterLiteral(this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parseStringLiteral (UnicodeChar quoteChar)
    {
        if (quoteChar != '"' && quoteChar != '\'')
            return false;

        ++input;
        currentStringValue = {};

        for (;;)
        {
            auto c = input.getAndAdvance();

            if (c == quoteChar)
                break;

            if (c == '\\')
            {
                c = input.getAndAdvance();

                switch (c)
                {
                    case '"':
                    case '\'':
                    case '\\':
                    case '/':  break;

                    case 'a':  c = '\a'; break;
                    case 'b':  c = '\b'; break;
                    case 'f':  c = '\f'; break;
                    case 'n':  c = '\n'; break;
                    case 'r':  c = '\r'; break;
                    case 't':  c = '\t'; break;

                    case 'u':
                    {
                        c = 0;

                        for (int i = 4; --i >= 0;)
                        {
                            auto digitValue = choc::text::hexDigitToInt (input.getAndAdvance());

                            if (digitValue < 0)
                            {
                                location.location = input;
                                throwError (Errors::errorInEscapeCode());
                            }

                            c = (UnicodeChar) ((c << 4) + static_cast<UnicodeChar> (digitValue));
                        }

                        break;
                    }
                }
            }

            if (c == 0)
                throwError (Errors::endOfInputInStringConstant());

            appendUTF8 (currentStringValue, c);
        }

        checkCharacterImmediatelyAfterLiteral();
        return true;
    }